

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0_1;
  v4sf fx;
  v4sf tmp_1;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  int local_d38;
  float *local_d28;
  float *local_d20;
  undefined1 (*local_d18) [16];
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c08;
  undefined8 uStack_c00;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_pow op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  if (elempack == 4) {
    local_d28 = outptr;
    local_d20 = ptr1;
    local_d18 = (undefined1 (*) [16])ptr;
    for (local_d38 = 0; local_d38 < w; local_d38 = local_d38 + 1) {
      fVar6 = *local_d20;
      local_c8 = (float)*(undefined8 *)*local_d18;
      fStack_c4 = (float)((ulong)*(undefined8 *)*local_d18 >> 0x20);
      fStack_c0 = (float)*(undefined8 *)(*local_d18 + 8);
      fStack_bc = (float)((ulong)*(undefined8 *)(*local_d18 + 8) >> 0x20);
      auVar2._8_8_ = 0x80000000800000;
      auVar2._0_8_ = 0x80000000800000;
      auVar4 = maxps(*local_d18,auVar2);
      local_a78 = auVar4._0_8_;
      uStack_a70 = auVar4._8_8_;
      local_a8 = auVar4._0_4_;
      uStack_a4 = auVar4._4_4_;
      uStack_a0 = auVar4._8_4_;
      uStack_9c = auVar4._12_4_;
      uVar3 = local_a78 & 0x807fffff807fffff | 0x3f0000003f000000;
      uVar5 = uStack_a70 & 0x807fffff807fffff | 0x3f0000003f000000;
      ptr1_local._0_4_ = (float)uVar3;
      ptr1_local._4_4_ = (float)(uVar3 >> 0x20);
      ptr_local._0_4_ = (float)uVar5;
      ptr_local._4_4_ = (float)(uVar5 >> 0x20);
      uVar3 = uVar3 & CONCAT44(-(uint)(ptr1_local._4_4_ < 0.70710677),
                               -(uint)(ptr1_local._0_4_ < 0.70710677));
      uVar5 = uVar5 & CONCAT44(-(uint)(ptr_local._4_4_ < 0.70710677),
                               -(uint)(ptr_local._0_4_ < 0.70710677));
      uVar15 = CONCAT44(-(uint)(ptr1_local._4_4_ < 0.70710677),
                        -(uint)(ptr1_local._0_4_ < 0.70710677)) & 0x3f8000003f800000;
      uVar16 = CONCAT44(-(uint)(ptr_local._4_4_ < 0.70710677),-(uint)(ptr_local._0_4_ < 0.70710677))
               & 0x3f8000003f800000;
      local_a08 = (float)uVar15;
      fStack_a04 = (float)(uVar15 >> 0x20);
      fStack_a00 = (float)uVar16;
      fStack_9fc = (float)(uVar16 >> 0x20);
      local_a08 = ((float)(int)((local_a8 >> 0x17) - 0x7f) + 1.0) - local_a08;
      fStack_a04 = ((float)(int)((uStack_a4 >> 0x17) - 0x7f) + 1.0) - fStack_a04;
      fStack_a00 = ((float)(int)((uStack_a0 >> 0x17) - 0x7f) + 1.0) - fStack_a00;
      fStack_9fc = ((float)(int)((uStack_9c >> 0x17) - 0x7f) + 1.0) - fStack_9fc;
      local_a48 = (float)uVar3;
      fStack_a44 = (float)(uVar3 >> 0x20);
      fStack_a40 = (float)uVar5;
      fStack_a3c = (float)(uVar5 >> 0x20);
      local_a48 = (ptr1_local._0_4_ - 1.0) + local_a48;
      fStack_a44 = (ptr1_local._4_4_ - 1.0) + fStack_a44;
      fStack_a40 = (ptr_local._0_4_ - 1.0) + fStack_a40;
      fStack_a3c = (ptr_local._4_4_ - 1.0) + fStack_a3c;
      local_a78 = CONCAT44(fStack_a04 * 0.6933594 +
                           fStack_a44 +
                           ((fStack_a04 * -0.00021219444 +
                            ((((((((fStack_a44 * 0.070376836 + -0.1151461) * fStack_a44 +
                                  0.116769984) * fStack_a44 + -0.12420141) * fStack_a44 + 0.14249323
                                ) * fStack_a44 + -0.16668057) * fStack_a44 + 0.20000714) *
                              fStack_a44 + -0.24999994) * fStack_a44 + 0.3333333) * fStack_a44 *
                            fStack_a44 * fStack_a44) - fStack_a44 * fStack_a44 * 0.5),
                           local_a08 * 0.6933594 +
                           local_a48 +
                           ((local_a08 * -0.00021219444 +
                            ((((((((local_a48 * 0.070376836 + -0.1151461) * local_a48 + 0.116769984)
                                  * local_a48 + -0.12420141) * local_a48 + 0.14249323) * local_a48 +
                               -0.16668057) * local_a48 + 0.20000714) * local_a48 + -0.24999994) *
                             local_a48 + 0.3333333) * local_a48 * local_a48 * local_a48) -
                           local_a48 * local_a48 * 0.5));
      uStack_a70._0_4_ =
           fStack_a00 * 0.6933594 +
           fStack_a40 +
           ((fStack_a00 * -0.00021219444 +
            ((((((((fStack_a40 * 0.070376836 + -0.1151461) * fStack_a40 + 0.116769984) * fStack_a40
                 + -0.12420141) * fStack_a40 + 0.14249323) * fStack_a40 + -0.16668057) * fStack_a40
              + 0.20000714) * fStack_a40 + -0.24999994) * fStack_a40 + 0.3333333) * fStack_a40 *
            fStack_a40 * fStack_a40) - fStack_a40 * fStack_a40 * 0.5);
      uStack_a70._4_4_ =
           fStack_9fc * 0.6933594 +
           fStack_a3c +
           ((fStack_9fc * -0.00021219444 +
            ((((((((fStack_a3c * 0.070376836 + -0.1151461) * fStack_a3c + 0.116769984) * fStack_a3c
                 + -0.12420141) * fStack_a3c + 0.14249323) * fStack_a3c + -0.16668057) * fStack_a3c
              + 0.20000714) * fStack_a3c + -0.24999994) * fStack_a3c + 0.3333333) * fStack_a3c *
            fStack_a3c * fStack_a3c) - fStack_a3c * fStack_a3c * 0.5);
      local_a78 = local_a78 | CONCAT44(-(uint)(fStack_c4 <= 0.0),-(uint)(local_c8 <= 0.0));
      uStack_a70 = uStack_a70 | CONCAT44(-(uint)(fStack_bc <= 0.0),-(uint)(fStack_c0 <= 0.0));
      local_c98 = (float)local_a78;
      fStack_c94 = (float)(local_a78 >> 0x20);
      fStack_c90 = (float)uStack_a70;
      fStack_c8c = (float)(uStack_a70 >> 0x20);
      local_c08 = CONCAT44(fVar6 * fStack_c94,fVar6 * local_c98);
      uStack_c00._0_4_ = fVar6 * fStack_c90;
      uStack_c00._4_4_ = fVar6 * fStack_c8c;
      auVar1._8_8_ = uStack_c00;
      auVar1._0_8_ = local_c08;
      auVar14._8_8_ = 0x42b0c0a542b0c0a5;
      auVar14._0_8_ = 0x42b0c0a542b0c0a5;
      auVar14 = minps(auVar1,auVar14);
      auVar4._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = maxps(auVar14,auVar4);
      local_b48 = auVar4._0_4_;
      fStack_b44 = auVar4._4_4_;
      fStack_b40 = auVar4._8_4_;
      fStack_b3c = auVar4._12_4_;
      fVar6 = local_b48 * 1.442695 + 0.5;
      fVar8 = fStack_b44 * 1.442695 + 0.5;
      fVar10 = fStack_b40 * 1.442695 + 0.5;
      fVar12 = fStack_b3c * 1.442695 + 0.5;
      fVar7 = (float)(int)fVar6;
      fVar9 = (float)(int)fVar8;
      fVar11 = (float)(int)fVar10;
      fVar13 = (float)(int)fVar12;
      local_c58 = CONCAT44(-(uint)(fVar8 < fVar9),-(uint)(fVar6 < fVar7));
      uStack_c50 = CONCAT44(-(uint)(fVar12 < fVar13),-(uint)(fVar10 < fVar11));
      local_bb8 = (float)(local_c58 & 0x3f8000003f800000);
      fStack_bb4 = (float)((local_c58 & 0x3f8000003f800000) >> 0x20);
      fStack_bb0 = (float)(uStack_c50 & 0x3f8000003f800000);
      fStack_bac = (float)((uStack_c50 & 0x3f8000003f800000) >> 0x20);
      fVar7 = fVar7 - local_bb8;
      fVar9 = fVar9 - fStack_bb4;
      fVar11 = fVar11 - fStack_bb0;
      fVar13 = fVar13 - fStack_bac;
      fVar6 = (local_b48 - fVar7 * 0.6933594) - fVar7 * -0.00021219444;
      fVar8 = (fStack_b44 - fVar9 * 0.6933594) - fVar9 * -0.00021219444;
      fVar10 = (fStack_b40 - fVar11 * 0.6933594) - fVar11 * -0.00021219444;
      fVar12 = (fStack_b3c - fVar13 * 0.6933594) - fVar13 * -0.00021219444;
      local_c68 = CONCAT44(((((((fVar8 * 0.00019875691 + 0.0013981999) * fVar8 + 0.008333452) *
                               fVar8 + 0.041665796) * fVar8 + 0.16666666) * fVar8 + 0.5) *
                            fVar8 * fVar8 + fVar8 + 1.0) * (float)((int)fVar9 + 0x7f),
                           ((((((fVar6 * 0.00019875691 + 0.0013981999) * fVar6 + 0.008333452) *
                               fVar6 + 0.041665796) * fVar6 + 0.16666666) * fVar6 + 0.5) *
                            fVar6 * fVar6 + fVar6 + 1.0) * (float)(((int)fVar7 + 0x7f) * 0x800000));
      uStack_c60 = CONCAT44(((((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) *
                                fVar12 + 0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) *
                             fVar12 * fVar12 + fVar12 + 1.0) * (float)((int)fVar13 + 0x7f),
                            ((((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) *
                                fVar10 + 0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5) *
                             fVar10 * fVar10 + fVar10 + 1.0) * (float)((int)fVar11 + 0x7f));
      *(undefined8 *)local_d28 = local_c68;
      *(undefined8 *)(local_d28 + 2) = uStack_c60;
      local_d18 = local_d18 + 1;
      local_d20 = local_d20 + 1;
      local_d28 = local_d28 + 4;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}